

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_3::anon_unknown_1::CompressionStash::~CompressionStash(CompressionStash *this)

{
  __pointer_type in_RDI;
  atomic<Imf_3_3::(anonymous_namespace)::CompressionStash_*> *unaff_retaddr;
  
  std::atomic<Imf_3_3::(anonymous_namespace)::CompressionStash_*>::store
            (unaff_retaddr,in_RDI,(memory_order)((ulong)in_RDI >> 0x20));
  std::mutex::lock(&in_RDI->_mutex);
  std::
  map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
  ::clear((map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
           *)0x12a8e2);
  std::mutex::unlock((mutex *)0x12a8ec);
  std::
  map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
  ::~map((map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
          *)0x12a8fc);
  return;
}

Assistant:

~CompressionStash ()
    {
        // technically not safe in that if there are multiple threads
        // running at object destruction time, another thread may have
        // retrieved the pointer, but not yet entered the mutex, but
        // then we run, destroying the mutex, and then they crash
        // against a destroyed mutex. But this code only happens at
        // static object destruction time, and only has
        // non-deterministic behavior when compiled statically.
        // so. this is about all we can do to add this feature without
        // changing the abi other than say don't have static/global
        // Header objects?
        s_stash.store (nullptr);
#if ILMTHREAD_THREADING_ENABLED
        // let's explicitly grab the lock and clear the map in case
        // there is someone waiting on a lock concurrently at static
        // destruction time, just to be pedantic
        _mutex.lock ();
        _store.clear ();
        _mutex.unlock ();
#endif
    }